

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void AdjustMeshPeriodicTextureCoordinatesHelper
               (ON_Mesh *mesh,ON_Xform *mesh_xform,float *mesh_T,int mesh_T_stride,int *Tsd,
               double two_pi_tc,ON_TextureMapping *mapping)

{
  TYPE TVar1;
  int iVar2;
  ON__CMeshFaceTC *pOVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int *piVar11;
  void *pvVar12;
  uint uVar13;
  uint uVar14;
  long lVar16;
  float *pfVar17;
  size_t sVar18;
  int *piVar19;
  uint uVar20;
  ON_Xform *pOVar21;
  ON_3fPoint *pOVar22;
  ON_Xform *pOVar23;
  uint uVar24;
  long lVar25;
  ON_MeshFace *pOVar26;
  long lVar27;
  ON_3fVector *pOVar28;
  bool bVar29;
  byte bVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  float fVar35;
  double dVar36;
  float fVar37;
  double dVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  double dVar42;
  undefined1 auVar43 [12];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  undefined8 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list;
  ON_Workspace ws;
  ON__CMeshFaceTC ftc;
  int sd [4];
  ON_SimpleArray<ON__CNewMeshFace> mflist;
  ON_3dVector n;
  ON__CChangeTextureCoordinateHelper helper;
  ON_3dPoint local_2d8;
  ON_MeshFace *local_2b8;
  float *local_2b0;
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [4];
  ON_2fPoint OStack_29c;
  ON_2fPoint OStack_294;
  ON_2fPoint OStack_28c;
  ON_2fPoint aOStack_284 [2];
  int local_274;
  int *local_270;
  ulong local_268;
  ON_3dPoint local_260;
  size_t local_248;
  float *local_240;
  undefined1 local_238 [24];
  undefined8 uStack_220;
  double local_218;
  uint local_1b8 [4];
  ON_MeshFace *local_1a8;
  long local_1a0;
  ulong local_198;
  double local_190;
  undefined1 local_188 [16];
  double local_178;
  undefined1 local_168 [16];
  double local_158;
  double local_148;
  ON_Xform *local_140;
  ON_Xform *local_138;
  ON_Xform *local_130;
  ON_SimpleArray<ON__CNewMeshFace> local_128;
  ON_3dVector local_110;
  double local_f8;
  undefined8 uStack_f0;
  ON_3dVector local_e0;
  ON_3dPoint local_c8;
  ON_Xform local_b0;
  ulong uVar15;
  undefined1 auVar44 [16];
  
  bVar30 = 0;
  iVar4 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  local_248 = (size_t)iVar4;
  if (((2 < (long)local_248) &&
      (uVar20 = (mesh->m_F).m_count, local_198 = (ulong)uVar20, 0 < (int)uVar20)) &&
     (iVar4 == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count)) {
    TVar1 = mapping->m_type;
    bVar29 = Tsd == (int *)0x0;
    local_1a0 = (long)mesh_T_stride;
    local_2b8 = (ON_MeshFace *)two_pi_tc;
    local_2b0 = mesh_T;
    local_270 = Tsd;
    if ((TVar1 != box_mapping || bVar29) || (mapping->m_texture_space != single)) {
      ON_Workspace::ON_Workspace((ON_Workspace *)&local_260);
      sVar18 = local_248;
      piVar11 = ON_Workspace::GetIntMemory((ON_Workspace *)&local_260,local_248);
      pvVar12 = ON_Workspace::GetMemory((ON_Workspace *)&local_260,sVar18 * 4);
      fVar33 = (float)((double)local_2b8 * 0.25);
      fVar32 = (float)((double)local_2b8 * 0.75);
      pfVar17 = local_2b0 + 1;
      sVar18 = 0;
      uVar20 = 0;
      iVar4 = 0;
      do {
        piVar11[sVar18] = 0;
        fVar35 = pfVar17[-1];
        *(float *)((long)pvVar12 + sVar18 * 4) = fVar35;
        if (bVar29 || TVar1 != cylinder_mapping) {
          if (TVar1 != box_mapping || bVar29) {
            if (TVar1 != sphere_mapping) goto LAB_004df255;
            uVar13 = 8;
            if ((0.001 <= *pfVar17) && (*pfVar17 <= 0.999)) goto LAB_004df255;
          }
          else {
            if ((local_270[sVar18] | 2U) != 3) goto LAB_004df279;
LAB_004df255:
            uVar13 = 1;
            if ((fVar33 <= fVar35) && (uVar13 = 4, fVar35 <= fVar32)) goto LAB_004df279;
          }
          piVar11[sVar18] = uVar13;
          uVar20 = uVar20 | uVar13;
          iVar4 = iVar4 + 1;
        }
        else if (local_270[sVar18] == 1) goto LAB_004df255;
LAB_004df279:
        sVar18 = sVar18 + 1;
        pfVar17 = pfVar17 + local_1a0;
      } while (local_248 != sVar18);
      if ((4 < uVar20) || ((0x13U >> uVar20 & 1) == 0)) {
        local_2a8 = (undefined1  [8])&PTR__ON_SimpleArray_008138c8;
        _auStack_2a0 = (ON__CMeshFaceTC *)0x0;
        OStack_29c.y = 0.0;
        OStack_294.x = 0.0;
        iVar4 = iVar4 * 4 + 0x80;
        if (iVar4 != 0) {
          ON_SimpleArray<ON__CMeshFaceTC>::SetCapacity
                    ((ON_SimpleArray<ON__CMeshFaceTC> *)local_2a8,(long)iVar4);
        }
        pOVar26 = (mesh->m_F).m_a;
        local_238._16_8_ = 0.0;
        uStack_220 = 0.0;
        local_238._0_8_ = 0.0;
        local_218 = 0.0;
        fVar35 = (float)(double)local_2b8;
        piVar19 = pOVar26->vi + 3;
        uVar7 = 0;
        do {
          uVar20 = piVar11[((ON_MeshFace *)(piVar19 + -3))->vi[0]];
          local_238._4_4_ = uVar20;
          uVar13 = piVar11[piVar19[-2]];
          uVar14 = piVar11[piVar19[-1]];
          local_238._12_4_ = uVar14;
          local_238._8_4_ = uVar13;
          uVar5 = piVar11[*piVar19];
          local_238._16_4_ = uVar5;
          uVar24 = uVar14 | uVar5 | uVar13 | uVar20;
          if ((4 < uVar24) || ((0x13U >> (uVar24 & 0x1f) & 1) == 0)) {
            local_238._0_4_ = 0xffffffff;
            local_238._20_4_ =
                 *(uint *)((long)pvVar12 + (long)((ON_MeshFace *)(piVar19 + -3))->vi[0] * 4);
            auVar39 = ZEXT416((uint)local_238._20_4_);
            fVar41 = *(float *)((long)pvVar12 + (long)piVar19[-2] * 4);
            fVar47 = *(float *)((long)pvVar12 + (long)piVar19[-1] * 4);
            uStack_220 = (double)CONCAT44(fVar47,fVar41);
            fVar48 = *(float *)((long)pvVar12 + (long)*piVar19 * 4);
            local_218 = (double)CONCAT44(local_218._4_4_,fVar48);
            iVar4 = -1;
            iVar6 = (int)uVar7;
            if ((uVar24 & 8) != 0) {
              iVar4 = -1;
              if (uVar20 == 8) {
                uVar15 = 0xfeb9b851;
                if (uVar5 != 8) {
                  uVar15 = (ulong)(uint)fVar48;
                }
                auVar43 = ZEXT812(0xfeb9b851);
                if (uVar13 != 8) {
                  auVar43._4_8_ = 0;
                  auVar43._0_4_ = fVar41;
                }
                auVar44._12_4_ = 0;
                auVar44._0_12_ = auVar43;
                fVar37 = (float)uVar15;
                fVar40 = auVar43._0_4_;
                if ((fVar37 == -1.234321e+38) && (!NAN(fVar37))) {
                  uVar20 = 8;
                  if ((fVar40 == -1.234321e+38) && (!NAN(fVar40))) goto LAB_004df488;
                }
                if ((fVar37 != -1.234321e+38) || (auVar39 = auVar44, NAN(fVar37))) {
                  if ((fVar40 != -1.234321e+38) || (NAN(fVar40))) {
                    auVar39._0_4_ = (fVar40 + fVar37) * 0.5;
                    auVar39._4_8_ = auVar43._4_8_;
                    auVar39._12_4_ = 0;
                  }
                  else {
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar15;
                  }
                }
                local_238._20_4_ = auVar39._0_4_;
                uVar20 = (uint)(fVar32 < (float)local_238._20_4_) << 2;
                if ((float)local_238._20_4_ < fVar33) {
                  uVar20 = 1;
                }
                uVar24 = uVar24 | uVar20;
                local_238._4_4_ = uVar20;
                local_238._0_4_ = iVar6;
                iVar4 = iVar6;
              }
LAB_004df488:
              if (uVar13 == 8) {
                uVar49 = 0xfeb9b851;
                uVar50 = 0;
                uVar51 = 0;
                if (uVar20 != 8) {
                  uVar49 = auVar39._0_8_;
                  uVar50 = auVar39._8_4_;
                  uVar51 = auVar39._12_4_;
                }
                auVar45._0_12_ = ZEXT812(0xfeb9b851);
                auVar45._12_4_ = 0;
                if (uVar14 != 8) {
                  auVar45 = ZEXT416((uint)fVar47);
                }
                fVar37 = (float)uVar49;
                fVar40 = auVar45._0_4_;
                if ((fVar37 == -1.234321e+38) && (!NAN(fVar37))) {
                  uVar13 = 8;
                  if ((fVar40 == -1.234321e+38) && (!NAN(fVar40))) goto LAB_004df52a;
                }
                if ((fVar37 != -1.234321e+38) || (NAN(fVar37))) {
                  if ((fVar40 != -1.234321e+38) || (NAN(fVar40))) {
                    auVar45._0_4_ = (fVar40 + fVar37) * 0.5;
                  }
                  else {
                    auVar45._8_4_ = uVar50;
                    auVar45._0_8_ = uVar49;
                    auVar45._12_4_ = uVar51;
                  }
                }
                fVar41 = auVar45._0_4_;
                uStack_220 = (double)CONCAT44(fVar47,fVar41);
                uVar13 = (uint)(fVar32 < fVar41) << 2;
                if (fVar41 < fVar33) {
                  uVar13 = 1;
                }
                local_238._8_4_ = uVar13;
                uVar24 = uVar24 | uVar13;
                local_238._0_4_ = iVar6;
                iVar4 = iVar6;
              }
LAB_004df52a:
              if (uVar14 == 8) {
                fVar40 = -1.234321e+38;
                if (uVar13 != 8) {
                  fVar40 = fVar41;
                }
                fVar37 = auVar39._0_4_;
                uVar14 = uVar20;
                if (piVar19[-1] != *piVar19) {
                  fVar37 = fVar48;
                  uVar14 = uVar5;
                }
                fVar46 = -1.234321e+38;
                if (uVar14 != 8) {
                  fVar46 = fVar37;
                }
                if ((fVar40 == -1.234321e+38) && (!NAN(fVar40))) {
                  uVar14 = 8;
                  if ((fVar46 == -1.234321e+38) && (!NAN(fVar46))) goto LAB_004df5fa;
                }
                if (((fVar40 != -1.234321e+38) || (fVar47 = fVar46, NAN(fVar40))) &&
                   ((fVar46 != -1.234321e+38 || (fVar47 = fVar40, NAN(fVar46))))) {
                  fVar47 = (fVar40 + fVar46) * 0.5;
                }
                uVar14 = (uint)(fVar32 < fVar47) << 2;
                if (fVar47 < fVar33) {
                  uVar14 = 1;
                }
                uStack_220 = (double)CONCAT44(fVar47,(float)uStack_220);
                local_238._12_4_ = uVar14;
                if (piVar19[-1] == *piVar19) {
                  local_218 = (double)CONCAT44(local_218._4_4_,fVar47);
                  local_238._16_4_ = uVar14;
                  uVar5 = uVar14;
                  fVar48 = fVar47;
                }
                uVar24 = uVar24 | uVar14;
                local_238._0_4_ = iVar6;
                iVar4 = iVar6;
              }
LAB_004df5fa:
              if ((uVar5 == 8) && (uVar5 = 8, piVar19[-1] != *piVar19)) {
                fVar40 = -1.234321e+38;
                if (uVar14 != 8) {
                  fVar40 = fVar47;
                }
                fVar37 = -1.234321e+38;
                if (uVar20 != 8) {
                  fVar37 = auVar39._0_4_;
                }
                if ((((fVar40 != -1.234321e+38) || (NAN(fVar40))) || (fVar37 != -1.234321e+38)) ||
                   (NAN(fVar37))) {
                  if (((fVar40 != -1.234321e+38) || (fVar48 = fVar37, NAN(fVar40))) &&
                     ((fVar37 != -1.234321e+38 || (fVar48 = fVar40, NAN(fVar37))))) {
                    fVar48 = (fVar40 + fVar37) * 0.5;
                  }
                  local_218 = (double)CONCAT44(local_218._4_4_,fVar48);
                  uVar5 = (uint)(fVar32 < fVar48) << 2;
                  if (fVar48 < fVar33) {
                    uVar5 = 1;
                  }
                  local_238._16_4_ = uVar5;
                  uVar24 = uVar24 | uVar5;
                  local_238._0_4_ = iVar6;
                  iVar4 = iVar6;
                }
              }
            }
            if ((~uVar24 & 5) == 0) {
              fVar40 = auVar39._0_4_;
              if (((double)local_2b8 != 1.0) || (NAN((double)local_2b8))) {
                if (uVar20 == 4) {
                  fVar37 = 0.0;
                  fVar46 = (fVar35 - fVar40) + 0.0;
                }
                else {
                  fVar37 = 0.0;
                  fVar46 = 0.0;
                  if (uVar20 == 1) {
                    fVar37 = fVar40 + 0.0;
                  }
                }
                if (uVar13 == 4) {
                  fVar46 = fVar46 + (fVar35 - fVar41);
                }
                else if (uVar13 == 1) {
                  fVar37 = fVar37 + fVar41;
                }
                if (uVar14 == 4) {
                  fVar46 = fVar46 + (fVar35 - fVar47);
                }
                else if (uVar14 == 1) {
                  fVar37 = fVar37 + fVar47;
                }
                if (piVar19[-1] != *piVar19) {
                  if (uVar5 == 4) {
                    fVar46 = fVar46 + (fVar35 - fVar48);
                  }
                  else if (uVar5 == 1) {
                    fVar37 = fVar37 + fVar48;
                  }
                }
                if (fVar46 <= fVar37) {
                  if (uVar20 == 4) {
                    local_238._16_8_ = local_238._16_8_ & 0xffffffff;
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  if (uVar13 == 4) {
                    uStack_220 = (double)((ulong)(uint)uStack_220._4_4_ << 0x20);
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  if (uVar14 == 4) {
                    uStack_220 = (double)((ulong)uStack_220 & 0xffffffff);
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  if (uVar5 == 4) {
                    local_218._0_4_ = 0.0;
                    fVar41 = local_218._0_4_;
                    goto LAB_004df849;
                  }
                }
                else {
                  if (uVar20 == 1) {
                    local_238._20_4_ = fVar35;
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  if (uVar13 == 1) {
                    uStack_220 = (double)CONCAT44(uStack_220._4_4_,fVar35);
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  if (uVar14 == 1) {
                    uStack_220 = (double)CONCAT44(fVar35,(float)uStack_220);
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                  fVar41 = fVar35;
                  if (uVar5 == 1) {
LAB_004df849:
                    local_218 = (double)CONCAT44(local_218._4_4_,fVar41);
                    local_238._0_4_ = iVar6;
                    iVar4 = iVar6;
                  }
                }
              }
              else {
                if (uVar20 == 1) {
                  local_238._20_4_ = fVar40 + 1.0;
                  local_238._0_4_ = iVar6;
                  iVar4 = iVar6;
                }
                if (uVar13 == 1) {
                  uStack_220 = (double)CONCAT44(uStack_220._4_4_,fVar41 + 1.0);
                  local_238._0_4_ = iVar6;
                  iVar4 = iVar6;
                }
                if (uVar14 == 1) {
                  uStack_220 = (double)CONCAT44(fVar47 + 1.0,(float)uStack_220);
                  local_238._0_4_ = iVar6;
                  iVar4 = iVar6;
                }
                if (uVar5 == 1) {
                  fVar41 = fVar48 + 1.0;
                  goto LAB_004df849;
                }
              }
            }
            if (-1 < iVar4) {
              ON_SimpleArray<ON__CMeshFaceTC>::Append
                        ((ON_SimpleArray<ON__CMeshFaceTC> *)local_2a8,(ON__CMeshFaceTC *)local_238);
            }
          }
          uVar7 = uVar7 + 1;
          piVar19 = piVar19 + 4;
        } while (local_198 != uVar7);
        if (0 < (long)(int)OStack_29c.y) {
          lVar16 = (long)(int)OStack_29c.y * 0x28;
          lVar27 = 0;
          iVar4 = 0;
          do {
            iVar6 = *(int *)((long)_auStack_2a0->quad + lVar27 + -4);
            fVar33 = *(float *)((long)_auStack_2a0->Tx + lVar27);
            pfVar17 = (float *)((long)pvVar12 + (long)pOVar26[iVar6].vi[0] * 4);
            if ((fVar33 != *pfVar17) || (NAN(fVar33) || NAN(*pfVar17))) {
              _auStack_2a0->bSetT[lVar27] = true;
              iVar4 = iVar4 + 1;
            }
            fVar33 = *(float *)((long)_auStack_2a0->Tx + lVar27 + 4);
            pfVar17 = (float *)((long)pvVar12 + (long)pOVar26[iVar6].vi[1] * 4);
            if ((fVar33 != *pfVar17) || (NAN(fVar33) || NAN(*pfVar17))) {
              _auStack_2a0->bSetT[lVar27 + 1] = true;
              iVar4 = iVar4 + 1;
            }
            fVar33 = *(float *)((long)_auStack_2a0->Tx + lVar27 + 8);
            iVar2 = pOVar26[iVar6].vi[2];
            pfVar17 = (float *)((long)pvVar12 + (long)iVar2 * 4);
            if ((fVar33 != *pfVar17) || (NAN(fVar33) || NAN(*pfVar17))) {
              _auStack_2a0->bSetT[lVar27 + 2] = true;
              iVar4 = iVar4 + 1;
            }
            if (iVar2 != pOVar26[iVar6].vi[3]) {
              fVar33 = *(float *)((long)_auStack_2a0->Tx + lVar27 + 0xc);
              pfVar17 = (float *)((long)pvVar12 + (long)pOVar26[iVar6].vi[3] * 4);
              if ((fVar33 != *pfVar17) || (NAN(fVar33) || NAN(*pfVar17))) {
                _auStack_2a0->bSetT[lVar27 + 3] = true;
                iVar4 = iVar4 + 1;
              }
            }
            lVar27 = lVar27 + 0x28;
          } while (lVar16 != lVar27);
          if (0 < iVar4) {
            ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&local_b0,mesh,iVar4,&local_2b0);
            lVar27 = 0;
            do {
              pOVar3 = _auStack_2a0;
              pfVar17 = local_2b0;
              pOVar26 = (mesh->m_F).m_a + *(int *)((long)_auStack_2a0->quad + lVar27 + -4);
              if (_auStack_2a0->bSetT[lVar27] == true) {
                fVar33 = *(float *)((long)_auStack_2a0->Tx + lVar27);
                if ((local_2b0[pOVar26->vi[0] * mesh_T_stride] != fVar33) ||
                   (NAN(local_2b0[pOVar26->vi[0] * mesh_T_stride]) || NAN(fVar33))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar26->vi[0])
                  ;
                  pfVar17[iVar4 * mesh_T_stride] = fVar33;
                  pOVar26->vi[0] = iVar4;
                }
              }
              pfVar17 = local_2b0;
              if (pOVar3->bSetT[lVar27 + 1] == true) {
                fVar33 = *(float *)((long)pOVar3->Tx + lVar27 + 4);
                if ((local_2b0[pOVar26->vi[1] * mesh_T_stride] != fVar33) ||
                   (NAN(local_2b0[pOVar26->vi[1] * mesh_T_stride]) || NAN(fVar33))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar26->vi[1])
                  ;
                  pfVar17[iVar4 * mesh_T_stride] = fVar33;
                  pOVar26->vi[1] = iVar4;
                }
              }
              pfVar17 = local_2b0;
              if (pOVar3->bSetT[lVar27 + 2] == true) {
                fVar33 = *(float *)((long)pOVar3->Tx + lVar27 + 8);
                iVar4 = pOVar26->vi[2];
                if ((local_2b0[iVar4 * mesh_T_stride] != fVar33) ||
                   (NAN(local_2b0[iVar4 * mesh_T_stride]) || NAN(fVar33))) {
                  iVar6 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,iVar4);
                  piVar11 = pOVar26->vi + 2;
                  pfVar17[iVar6 * mesh_T_stride] = fVar33;
                  if (iVar4 == pOVar26->vi[3]) {
                    *piVar11 = iVar6;
                    piVar11 = pOVar26->vi + 3;
                  }
                  *piVar11 = iVar6;
                }
              }
              pfVar17 = local_2b0;
              if (pOVar3->bSetT[lVar27 + 3] == true) {
                fVar33 = *(float *)((long)pOVar3->Tx + lVar27 + 0xc);
                if ((local_2b0[pOVar26->vi[3] * mesh_T_stride] != fVar33) ||
                   (NAN(local_2b0[pOVar26->vi[3] * mesh_T_stride]) || NAN(fVar33))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar26->vi[3])
                  ;
                  pfVar17[iVar4 * mesh_T_stride] = fVar33;
                  pOVar26->vi[3] = iVar4;
                }
              }
              lVar27 = lVar27 + 0x28;
            } while (lVar16 != lVar27);
            ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&local_b0);
          }
        }
        ON_SimpleArray<ON__CMeshFaceTC>::~ON_SimpleArray
                  ((ON_SimpleArray<ON__CMeshFaceTC> *)local_2a8);
      }
      ON_Workspace::~ON_Workspace((ON_Workspace *)&local_260);
    }
    else {
      pOVar26 = (mesh->m_F).m_a;
      local_128._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00813888;
      local_128.m_a = (ON__CNewMeshFace *)0x0;
      local_128.m_count = 0;
      local_128.m_capacity = 0;
      local_240 = mesh_T;
      ON_SimpleArray<ON__CNewMeshFace>::SetCapacity(&local_128,0x200);
      local_130 = &mapping->m_Pxyz;
      local_138 = &mapping->m_Nxyz;
      local_140 = &mapping->m_uvw;
      uVar7 = 0;
      local_274 = 0;
      local_2b8 = pOVar26;
      local_1a8 = pOVar26;
      do {
        lVar16 = local_1a0;
        pfVar17 = local_240;
        uVar20 = local_270[pOVar26[uVar7].vi[0]];
        local_1b8[1] = local_270[pOVar26[uVar7].vi[1]];
        iVar4 = pOVar26[uVar7].vi[2];
        local_1b8[2] = local_270[iVar4];
        iVar6 = pOVar26[uVar7].vi[3];
        local_1b8[3] = local_270[iVar6];
        local_268 = uVar7;
        local_1b8[0] = uVar20;
        if (((uVar20 != local_1b8[1]) || (uVar20 != local_1b8[2])) || (uVar20 != local_1b8[3])) {
          pOVar26 = pOVar26 + uVar7;
          OStack_28c.y = 0.0;
          aOStack_284[0].x = 0.0;
          aOStack_284[0].y = 0.0;
          OStack_29c.y = 0.0;
          OStack_294.x = 0.0;
          OStack_294.y = 0.0;
          OStack_28c.x = 0.0;
          local_2a8 = (undefined1  [8])0x0;
          _auStack_2a0 = (ON__CMeshFaceTC *)0x0;
          ON_2fPoint::operator=
                    ((ON_2fPoint *)(auStack_2a0 + 4),local_240 + pOVar26->vi[0] * local_1a0);
          ON_2fPoint::operator=(&OStack_294,pfVar17 + pOVar26->vi[1] * lVar16);
          ON_2fPoint::operator=(&OStack_28c,pfVar17 + pOVar26->vi[2] * lVar16);
          ON_2fPoint::operator=(aOStack_284,pfVar17 + pOVar26->vi[3] * lVar16);
          fVar33 = (float)(~-(uint)(0.5 < OStack_29c.x) & (uint)OStack_29c.x |
                          (uint)(1.0 - OStack_29c.x) & -(uint)(0.5 < OStack_29c.x));
          fVar32 = 0.0;
          if (0.0 <= fVar33) {
            fVar32 = (float)(~-(uint)(0.5 < OStack_29c.y) & (uint)OStack_29c.y |
                            (uint)(1.0 - OStack_29c.y) & -(uint)(0.5 < OStack_29c.y));
            if (fVar32 <= fVar33) {
              fVar33 = fVar32;
            }
            fVar32 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar33);
          }
          uVar13 = (iVar4 != iVar6) + 3;
          uVar15 = (ulong)uVar13;
          uVar7 = 1;
          do {
            fVar33 = *(float *)(auStack_2a0 + uVar7 * 8 + 4);
            fVar33 = (float)(~-(uint)(0.5 < fVar33) & (uint)fVar33 |
                            (uint)(1.0 - fVar33) & -(uint)(0.5 < fVar33));
            fVar35 = 0.0;
            if (0.0 <= fVar33) {
              fVar35 = (&OStack_29c)[uVar7].y;
              fVar35 = (float)(~-(uint)(0.5 < fVar35) & (uint)fVar35 |
                              (uint)(1.0 - fVar35) & -(uint)(0.5 < fVar35));
              if (fVar35 <= fVar33) {
                fVar33 = fVar35;
              }
              fVar35 = (float)(~-(uint)(fVar35 < 0.0) & (uint)fVar33);
            }
            if (fVar32 < fVar35) {
              uVar20 = local_1b8[uVar7];
              fVar32 = fVar35;
            }
            uVar7 = uVar7 + 1;
          } while (uVar15 != uVar7);
          uVar7 = 0;
          do {
            if (local_1b8[uVar7] == uVar20) goto LAB_004defdb;
            iVar4 = local_2b8->vi[uVar7];
            ON_3dVector::ON_3dVector((ON_3dVector *)local_168,0.0,0.0,0.0);
            pOVar22 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
            bVar29 = ON_Mesh::HasVertexNormals(mesh);
            pOVar28 = (ON_3fVector *)0x0;
            if (bVar29) {
              pOVar28 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
            }
            pOVar21 = &ON_Xform::IdentityTransformation;
            pOVar23 = &local_b0;
            for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
              pOVar23->m_xform[0][0] = pOVar21->m_xform[0][0];
              pOVar21 = (ON_Xform *)((long)pOVar21 + ((ulong)bVar30 * -2 + 1) * 8);
              pOVar23 = (ON_Xform *)((long)pOVar23 + ((ulong)bVar30 * -2 + 1) * 8);
            }
            pOVar21 = &ON_Xform::IdentityTransformation;
            pdVar8 = (double *)local_238;
            for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
              *pdVar8 = pOVar21->m_xform[0][0];
              pOVar21 = (ON_Xform *)((long)pOVar21 + ((ulong)bVar30 * -2 + 1) * 8);
              pdVar8 = pdVar8 + (ulong)bVar30 * -2 + 1;
            }
            if (((mesh_xform == (ON_Xform *)0x0) || (bVar29 = ON_Xform::IsZero(mesh_xform), bVar29))
               || (bVar29 = ON_Xform::IsIdentity(mesh_xform,0.0), bVar29)) {
LAB_004de89e:
              pdVar8 = (double *)0x0;
              bVar29 = false;
            }
            else {
              dVar34 = ON_Xform::GetMappingXforms(mesh_xform,&local_b0,(ON_Xform *)local_238);
              if ((dVar34 == 0.0) && (!NAN(dVar34))) goto LAB_004de89e;
              pdVar8 = ON_Xform::operator[](&local_b0,0);
              pdVar9 = ON_Xform::operator[]((ON_Xform *)local_238,0);
              bVar29 = pdVar9 != (double *)0x0;
            }
            if ((pOVar28 == (ON_3fVector *)0x0) || (mapping->m_projection != ray_projection)) {
              pOVar22 = pOVar22 + iVar4;
              if (pdVar8 == (double *)0x0) {
                ON_3dPoint::operator=((ON_3dPoint *)local_188,pOVar22);
              }
              else {
                dVar36 = (double)pOVar22->x;
                dVar38 = (double)pOVar22->y;
                dVar42 = (double)pOVar22->z;
                dVar34 = pdVar8[0xe] * dVar42 + pdVar8[0xc] * dVar36 + pdVar8[0xd] * dVar38 +
                         pdVar8[0xf];
                uVar31 = -(ulong)(dVar34 != 0.0);
                local_178 = (double)(~uVar31 & 0x3ff0000000000000 | (ulong)(1.0 / dVar34) & uVar31);
                dVar34 = local_178 *
                         (pdVar8[7] + dVar42 * pdVar8[6] + dVar36 * pdVar8[4] + dVar38 * pdVar8[5]);
                local_188._8_4_ = SUB84(dVar34,0);
                local_188._0_8_ =
                     local_178 *
                     (pdVar8[3] + dVar42 * pdVar8[2] + dVar36 * *pdVar8 + dVar38 * pdVar8[1]);
                local_188._12_4_ = (int)((ulong)dVar34 >> 0x20);
                local_178 = (dVar42 * pdVar8[10] + dVar36 * pdVar8[8] + dVar38 * pdVar8[9] +
                            pdVar8[0xb]) * local_178;
              }
            }
            else {
              pOVar22 = pOVar22 + iVar4;
              if (bVar29 && pdVar8 != (double *)0x0) {
                dVar34 = (double)pOVar22->x;
                dVar38 = (double)pOVar22->y;
                dVar36 = (double)pOVar22->z;
                dVar42 = pdVar8[0xe] * dVar36 + pdVar8[0xc] * dVar34 + pdVar8[0xd] * dVar38 +
                         pdVar8[0xf];
                uVar31 = -(ulong)(dVar42 != 0.0);
                local_178 = (double)(~uVar31 & 0x3ff0000000000000 | (ulong)(1.0 / dVar42) & uVar31);
                local_188._8_8_ =
                     local_178 *
                     (pdVar8[7] + dVar36 * pdVar8[6] + dVar34 * pdVar8[4] + dVar38 * pdVar8[5]);
                local_188._0_8_ =
                     local_178 *
                     (pdVar8[3] + dVar36 * pdVar8[2] + dVar34 * *pdVar8 + dVar38 * pdVar8[1]);
                local_178 = (dVar36 * pdVar8[10] + dVar34 * pdVar8[8] + dVar38 * pdVar8[9] +
                            pdVar8[0xb]) * local_178;
                dVar34 = (double)pOVar28[iVar4].x;
                dVar36 = (double)pOVar28[iVar4].y;
                dVar38 = (double)pOVar28[iVar4].z;
                local_168._0_8_ = dVar38 * pdVar8[2] + dVar34 * *pdVar8 + dVar36 * pdVar8[1];
                local_168._8_8_ = dVar38 * pdVar8[6] + dVar34 * pdVar8[4] + dVar36 * pdVar8[5];
                local_158 = pdVar8[8] * dVar34 + pdVar8[9] * dVar36 + pdVar8[10] * dVar38;
                ON_3dVector::Unitize((ON_3dVector *)local_168);
              }
              else {
                ON_3dPoint::operator=((ON_3dPoint *)local_188,pOVar22);
                ON_3dVector::operator=((ON_3dVector *)local_168,pOVar28 + iVar4);
              }
            }
            ON_Xform::operator*(&local_2d8,local_130,(ON_3dPoint *)local_188);
            ON_Xform::operator*(&local_110,local_138,(ON_3dVector *)local_168);
            ON_3dVector::Unitize(&local_110);
            uVar31 = uVar7;
            if (mapping->m_projection != ray_projection) goto LAB_004dee59;
            iVar4 = 0;
            bVar29 = true;
            switch(uVar20) {
            case 1:
              goto switchD_004dec5c_caseD_1;
            case 2:
              goto switchD_004dec5c_caseD_2;
            case 3:
              iVar4 = 1;
              break;
            case 4:
              iVar4 = 1;
              goto LAB_004dec82;
            case 5:
              iVar4 = 2;
              break;
            case 6:
              iVar4 = 2;
LAB_004dec82:
              bVar29 = false;
switchD_004dec5c_caseD_2:
              dVar34 = 1.0;
              goto LAB_004dec8c;
            default:
              goto switchD_004dec5c_default;
            }
            bVar29 = false;
switchD_004dec5c_caseD_1:
            dVar34 = -1.0;
LAB_004dec8c:
            dVar38 = dVar34 - *(double *)((long)&local_2d8.x + (ulong)(uint)(iVar4 * 8));
            dVar36 = *(double *)((long)&local_110.x + (ulong)(uint)(iVar4 * 8));
            if ((double)((ulong)dVar36 & (ulong)DAT_00697010) * 1e+100 <=
                (double)((ulong)dVar38 & (ulong)DAT_00697010)) {
switchD_004dec5c_default:
              dVar36 = 5.0;
              dVar34 = -1.23432101234321e+308;
              switch(uVar20) {
              case 0:
                goto switchD_004dee08_caseD_0;
              case 1:
                goto switchD_004dee08_caseD_1;
              case 2:
                goto switchD_004dee08_caseD_2;
              case 3:
                goto switchD_004dee08_caseD_3;
              case 4:
                goto switchD_004dee08_caseD_4;
              case 5:
                goto switchD_004dee08_caseD_5;
              case 6:
                goto switchD_004dee08_caseD_6;
              default:
                goto switchD_004dee08_default;
              }
            }
            local_f8 = dVar38 / dVar36;
            uStack_f0 = 0;
            local_190 = dVar34;
            operator*(&local_e0,local_f8,&local_110);
            ON_3dPoint::operator+(&local_260,&local_2d8,&local_e0);
            if (!bVar29) {
              local_148 = local_260.x;
              pdVar8 = ON_3dPoint::operator[](&local_260,iVar4);
              local_260.x = *pdVar8;
              pdVar8 = ON_3dPoint::operator[](&local_260,iVar4);
              *pdVar8 = local_148;
            }
            if (((1.490116119385e-08 < ABS(local_260.x - local_190)) ||
                (100000000.0 < ABS(local_260.y))) ||
               (dVar34 = local_f8, 100000000.0 < ABS(local_260.z))) goto switchD_004dec5c_default;
switchD_004dee08_caseD_0:
            operator*(&local_e0,dVar34,&local_110);
            ON_3dPoint::operator+(&local_260,&local_2d8,&local_e0);
            local_2d8.z = local_260.z;
            local_2d8.y = local_260.y;
            local_2d8.x = local_260.x;
LAB_004dee59:
            dVar36 = 5.0;
            switch(uVar20) {
            case 1:
switchD_004dee08_caseD_1:
              local_2d8.x = -local_2d8.y;
              local_2d8.y = local_2d8.z;
              dVar36 = 3.0;
              break;
            case 2:
switchD_004dee08_caseD_2:
              local_2d8.x = local_2d8.y;
              local_2d8.y = local_2d8.z;
              dVar36 = 1.0;
              break;
            case 3:
switchD_004dee08_caseD_3:
              local_2d8.y = local_2d8.z;
              dVar36 = 0.0;
              break;
            case 4:
switchD_004dee08_caseD_4:
              local_2d8.y = local_2d8.z;
              local_2d8.x = -local_2d8.x;
              dVar36 = 2.0;
              break;
            case 5:
switchD_004dee08_caseD_5:
              local_2d8.x = -local_2d8.x;
              dVar36 = 4.0;
              break;
            case 6:
              break;
            default:
              goto switchD_004dee08_default;
            }
switchD_004dee08_caseD_6:
            local_2d8.x = local_2d8.x * (double)DAT_006a29f0 + (double)DAT_006a29f0;
            local_2d8.z = 0.0;
            if (mapping->m_texture_space == divided) {
              dVar34 = 6.0;
              if (mapping->m_bCapped == false) {
                dVar34 = 4.0;
              }
              local_2d8.x = (dVar36 + local_2d8.x) / dVar34;
            }
            local_2d8.y = local_2d8.y * DAT_006a29f0._8_8_ + DAT_006a29f0._8_8_;
            ON_Xform::operator*(&local_c8,local_140,&local_2d8);
            bVar29 = ON_3dPoint::IsValid(&local_c8);
            if (!bVar29) break;
            fVar33 = (float)local_c8.x;
            fVar32 = (float)local_c8.y;
            if ((*(float *)(auStack_2a0 + uVar7 * 8 + 4) != fVar33) ||
               (NAN(*(float *)(auStack_2a0 + uVar7 * 8 + 4)) || NAN(fVar33))) {
LAB_004defca:
              *(ulong *)(auStack_2a0 + uVar7 * 8 + 4) = CONCAT44(fVar32,fVar33);
              auStack_2a0[uVar7] = 1;
              local_2a8._4_4_ = local_2a8._4_4_ + 1;
            }
            else if (((&OStack_29c)[uVar7].y != fVar32) ||
                    (NAN((&OStack_29c)[uVar7].y) || NAN(fVar32))) goto LAB_004defca;
LAB_004defdb:
            uVar7 = uVar7 + 1;
            uVar31 = uVar15;
          } while (uVar15 != uVar7);
switchD_004dee08_default:
          uVar50 = local_2a8._4_4_;
          pOVar26 = local_1a8;
          if (0 < (int)local_2a8._4_4_ && uVar13 <= (uint)uVar31) {
            local_2a8._0_4_ = (int)local_268;
            ON_SimpleArray<ON__CNewMeshFace>::Append(&local_128,(ON__CNewMeshFace *)local_2a8);
            local_274 = local_274 + uVar50;
            pOVar26 = local_1a8;
          }
        }
        uVar7 = local_268 + 1;
        local_2b8 = local_2b8 + 1;
      } while (uVar7 != local_198);
      if (0 < local_274) {
        ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                  ((ON__CChangeTextureCoordinateHelper *)&local_b0,mesh,local_274 + (int)local_248,
                   &local_240);
        lVar16 = (long)local_128.m_count;
        if (0 < lVar16) {
          lVar27 = 0;
          do {
            local_2a8 = *(undefined1 (*) [8])(local_128.m_a + lVar27);
            auVar39 = *(undefined1 (*) [16])&local_128.m_a[lVar27].tc[0].y;
            _auStack_2a0 = *(ON__CMeshFaceTC **)local_128.m_a[lVar27].bNewV;
            OStack_28c.y = local_128.m_a[lVar27].tc[2].y;
            aOStack_284[0] = (local_128.m_a[lVar27].tc + 2)[1];
            OStack_29c.y = auVar39._0_4_;
            OStack_294.x = auVar39._4_4_;
            OStack_294.y = auVar39._8_4_;
            OStack_28c.x = auVar39._12_4_;
            lVar10 = (long)(int)local_2a8._0_4_;
            pOVar26 = (mesh->m_F).m_a;
            iVar6 = pOVar26[lVar10].vi[2];
            iVar4 = pOVar26[lVar10].vi[3];
            lVar25 = 0;
            do {
              if (auStack_2a0[lVar25] == '\x01') {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar26[lVar10].vi,
                           (int)lVar25,*(float *)(auStack_2a0 + lVar25 * 8 + 4),
                           (&OStack_29c)[lVar25].y,local_240,mesh_T_stride);
              }
              lVar25 = lVar25 + 1;
            } while ((ulong)(iVar6 != iVar4) + 3 != lVar25);
            lVar27 = lVar27 + 1;
          } while (lVar27 != lVar16);
        }
        ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper
                  ((ON__CChangeTextureCoordinateHelper *)&local_b0);
      }
      ON_SimpleArray<ON__CNewMeshFace>::~ON_SimpleArray(&local_128);
    }
  }
  return;
}

Assistant:

static
void AdjustMeshPeriodicTextureCoordinatesHelper(
          ON_Mesh& mesh,
          const ON_Xform* mesh_xform,
          float* mesh_T,
          int    mesh_T_stride,
          const int* Tsd,
          double two_pi_tc,
          const ON_TextureMapping& mapping
          )
{
  // This helper adjusts texture coordinates on faces that
  // span the seam on mapping spheres and cylinders and
  // resolves the multiple valued problem that
  // exists at the poles of sphere mappings.

  const int vcnt = mesh.m_V.Count();
  const int fcnt = mesh.m_F.Count();
  if ( vcnt < 3 || fcnt < 1 || vcnt != mesh.m_T.Count() )
    return;

  // see if any texture coordinate adjustment is necessary
  const ON_TextureMapping::TYPE mapping_type = mapping.m_type;
  const bool bSphereCheck = ( ON_TextureMapping::TYPE::sphere_mapping == mapping_type );
  const bool bCylinderCheck = (Tsd && ON_TextureMapping::TYPE::cylinder_mapping == mapping_type);
  const bool bBoxCheck = (Tsd && ON_TextureMapping::TYPE::box_mapping == mapping_type);

  if ( bBoxCheck && ON_TextureMapping::TEXTURE_SPACE::single == mapping.m_texture_space )
  {
    AdjustSingleBoxTextureCoordinatesHelper( mesh, mesh_xform, mesh_T, mesh_T_stride, Tsd, mapping );
    return;
  }

  ON_Workspace ws;
  int* quad = ws.GetIntMemory(vcnt); // ~ws will free quad memory
  float* Tx = (float*)ws.GetMemory(vcnt*sizeof(Tx[0]));
  float t;
  int vi, ti, q=0;
  int ftc_count = 0;

  const float ang0 = (float)(0.25*two_pi_tc);
  const float ang1 = (float)(0.75*two_pi_tc);


  for ( vi = ti = 0; vi < vcnt; vi++, ti += mesh_T_stride )
  {
    quad[vi] = 0;
    Tx[vi] = mesh_T[ti];
    if ( bCylinderCheck )
    {
      if ( 1 != Tsd[vi] )
        continue;
    }
    else if ( bBoxCheck )
    {
      if ( 1 != Tsd[vi] && 3 != Tsd[vi] )
        continue;
    }
    else if ( bSphereCheck )
    {
      t = mesh_T[ti+1]; // t = "v" texture coordinate
      if ( t < 0.001f )
      {
        quad[vi] = 8; q |= 8; // south pole point
        ftc_count++;
        continue;
      }
      if ( t > 0.999f )
      {
        quad[vi] = 8; q |= 8; // north pole point
        ftc_count++;
        continue;
      }
    }

    t = Tx[vi]; // t = "u" texture coordinate
    if ( t < ang0 )
    {
      quad[vi] = 1; q |= 1; // longitude < pi/2
      ftc_count++;
    }
    else if ( t > ang1 )
    {
      quad[vi] = 4; q |= 4; // longitude > 3pi/2
      ftc_count++;
    }
  }

  if ( 0 == q || 1 == q || 4 == q )
  {
    // nothing needs to be adjusted
    return;
  }

  // 4*ftc_count = (over) estimate of the number of faces that
  // will be changed.
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list(ftc_count*4 + 128);
  ftc_count = 0;
  const ON_MeshFace* F = mesh.m_F.Array();
  const int* Fvi;
  int fi;
  ON__CMeshFaceTC ftc;
  memset(&ftc,0,sizeof(ftc));
  float t0, t1;

  for ( fi = 0; fi < fcnt; fi++ )
  {
    Fvi = F[fi].vi;

    ftc.quad[0] = quad[Fvi[0]];
    ftc.quad[1] = quad[Fvi[1]];
    ftc.quad[2] = quad[Fvi[2]];
    ftc.quad[3] = quad[Fvi[3]];

    q = (ftc.quad[0] | ftc.quad[1] | ftc.quad[2] | ftc.quad[3]);
    if ( 0 == q || 1 == q || 4 == q )
    {
      // no adjustments need to be made
      continue;
    }

    // ftc.fi will be set to fi if a texture coordinate needs to be adjusted
    ftc.fi = -1;

    ftc.Tx[0] = Tx[Fvi[0]];
    ftc.Tx[1] = Tx[Fvi[1]];
    ftc.Tx[2] = Tx[Fvi[2]];
    ftc.Tx[3] = Tx[Fvi[3]];

    if ( 0 != (8&q) )
    {
      // see if check for north/south sphere mapping poles and fix them
      if ( 8 == ftc.quad[0] )
      {
        t0 = (8 == ftc.quad[3]) ? ON_UNSET_FLOAT : ftc.Tx[3];
        t1 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[0] = PoleFix(t0,t1);
          ftc.quad[0] = ((ftc.Tx[0] < ang0) ? 1 : ((ftc.Tx[0] > ang1) ? 4 : 0));
          q |= ftc.quad[0];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[1] )
      {
        t0 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        t1 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[1] = PoleFix(t0,t1);
          ftc.quad[1] = ((ftc.Tx[1] < ang0) ? 1 : ((ftc.Tx[1] > ang1) ? 4 : 0));
          q |= ftc.quad[1];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[2] )
      {
        int k = (Fvi[2] == Fvi[3]) ? 0 : 3;
        t0 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        t1 = (8 == ftc.quad[k]) ? ON_UNSET_FLOAT : ftc.Tx[k];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[2] = PoleFix(t0,t1);
          ftc.quad[2] = ((ftc.Tx[2] < ang0) ? 1 : ((ftc.Tx[2] > ang1) ? 4 : 0));
          if ( !k )
          {
            ftc.Tx[3] = ftc.Tx[2];
            ftc.quad[3] = ftc.quad[2];
          }
          q |= ftc.quad[2];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[3] && Fvi[2] != Fvi[3] )
      {
        t0 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        t1 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[3] = PoleFix(t0,t1);
          ftc.quad[3] = ((ftc.Tx[3] < ang0) ? 1 : ((ftc.Tx[3] > ang1) ? 4 : 0));
          q |= ftc.quad[3];
          ftc.fi = fi;
        }
      }
    }

    if ( 5 == (5&q) )
    {
      // The face has corners on both sides of the seam
      if ( two_pi_tc == 1.0 )
      {
        if ( 1 == ftc.quad[0] ) {ftc.Tx[0] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[1] ) {ftc.Tx[1] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[2] ) {ftc.Tx[2] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[3] ) {ftc.Tx[3] += 1.0f; ftc.fi = fi;}
      }
      else
      {
        // With divided textures, wrapping the texture coordinate
        // does not work because it wraps into a region of the
        // texture not use by this "side".  In this case, the
        // only thing to do is to pick the best end of the texture
        // map and clamp the tcs that hang over.  If the mesh
        // has edges near the texture seam, the picture will
        // still look ok.
        float f0=0.0f, f1=0.0f, twopitc = (float)two_pi_tc;
        //int f0cnt=0, f1cnt=0;
        if ( 1 == ftc.quad[0] ) f0 += ftc.Tx[0]; else if ( 4 == ftc.quad[0] ) f1 += twopitc-ftc.Tx[0];
        if ( 1 == ftc.quad[1] ) f0 += ftc.Tx[1]; else if ( 4 == ftc.quad[1] ) f1 += twopitc-ftc.Tx[1];
        if ( 1 == ftc.quad[2] ) f0 += ftc.Tx[2]; else if ( 4 == ftc.quad[2] ) f1 += twopitc-ftc.Tx[2];
        if (Fvi[2] != Fvi[3])
        {
          if ( 1 == ftc.quad[3] ) f0 += ftc.Tx[3]; else if ( 4 == ftc.quad[3] ) f1 += twopitc-ftc.Tx[3];
        }
        if (f0 >= f1 )
        {
          // "most" of the face is on the left side of the texture
          // If a vertex is on the right side, clamp its tc to 0.
          if ( 4 == ftc.quad[0] ) {ftc.Tx[0] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[1] ) {ftc.Tx[1] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[2] ) {ftc.Tx[2] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[3] ) {ftc.Tx[3] = 0.0f; ftc.fi = fi;}
        }
        else
        {
          // "most" of the face is on the right side of the texture
          // If a vertex is on the left side, clamp its tc to two_pi_tc.
          if ( 1 == ftc.quad[0] ) {ftc.Tx[0] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[1] ) {ftc.Tx[1] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[2] ) {ftc.Tx[2] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[3] ) {ftc.Tx[3] = twopitc; ftc.fi = fi;}
        }
      }
    }

    if ( ftc.fi >= 0 )
    {
      // face will require special handling
      ftc_list.Append(ftc);
    }
  }

  ftc_count = ftc_list.Count();
  if ( ftc_count <= 0 )
    return;

  // Count the number of new vertices that will be added.
  int ftci;
  int newvcnt = 0;
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    Fvi = F[ftc_local.fi].vi;
    if ( ftc_local.Tx[0] != Tx[Fvi[0]] )
    {
      ftc_local.bSetT[0] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[1] != Tx[Fvi[1]] )
    {
      ftc_local.bSetT[1] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[2] != Tx[Fvi[2]] )
    {
      ftc_local.bSetT[2] = true;
      newvcnt++;
    }
    if ( Fvi[2] != Fvi[3] )
    {
      if ( ftc_local.Tx[3] != Tx[Fvi[3]] )
      {
        ftc_local.bSetT[3] = true;
        newvcnt++;
      }
    }
  }

  if ( newvcnt <= 0 )
    return;


  F = 0; // Setting them to nullptr makes sure anybody who
         // tries to use them below will crash.

  // reserve room for new vertex information
  ON__CChangeTextureCoordinateHelper helper(mesh,newvcnt,mesh_T);

  // add vertices and update mesh faces
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    const ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    int* meshFvi = mesh.m_F[ftc_local.fi].vi;

    if ( ftc_local.bSetT[0] )
    {
      helper.ChangeTextureCoordinate(meshFvi,0,ftc_local.Tx[0],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[1] )
    {
      helper.ChangeTextureCoordinate(meshFvi,1,ftc_local.Tx[1],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[2] )
    {
      helper.ChangeTextureCoordinate(meshFvi,2,ftc_local.Tx[2],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[3] )
    {
      helper.ChangeTextureCoordinate(meshFvi,3,ftc_local.Tx[3],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
  }
}